

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

void __thiscall Json::StyledWriter::writeValue(StyledWriter *this,Value *value)

{
  string *psVar1;
  pointer pbVar2;
  bool bVar3;
  ValueType VVar4;
  Json *pJVar5;
  Value *pVVar6;
  uint length;
  LargestUInt value_00;
  char *value_01;
  LargestInt value_02;
  char *pcVar7;
  pointer key;
  double value_03;
  char *str;
  char *end;
  string local_70;
  Members local_50;
  int local_38 [2];
  
  pVVar6 = value;
  VVar4 = Value::type(value);
  length = 0x12da74;
  switch(VVar4) {
  case nullValue:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"null","");
    pushValue(this,&local_70);
    goto LAB_001284ff;
  case intValue:
    pJVar5 = (Json *)Value::asLargestInt(value);
    valueToString_abi_cxx11_(&local_70,pJVar5,value_02);
    pushValue(this,&local_70);
    break;
  case uintValue:
    pJVar5 = (Json *)Value::asLargestUInt(value);
    valueToString_abi_cxx11_(&local_70,pJVar5,value_00);
    pushValue(this,&local_70);
    break;
  case realValue:
    value_03 = Value::asDouble(value);
    valueToString_abi_cxx11_(&local_70,(Json *)pVVar6,value_03);
    pushValue(this,&local_70);
    break;
  case stringValue:
    bVar3 = Value::getString(value,(char **)&local_50,(char **)local_38);
    if (bVar3) {
      valueToQuotedStringN_abi_cxx11_
                (&local_70,
                 (Json *)local_50.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (char *)(ulong)(uint)(local_38[0] -
                                      (int)local_50.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start),length);
      pushValue(this,&local_70);
      break;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    pushValue(this,&local_70);
LAB_001284ff:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return;
    }
    goto LAB_00128455;
  case booleanValue:
    bVar3 = Value::asBool(value);
    pcVar7 = "false";
    if (bVar3) {
      pcVar7 = "true";
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pcVar7,pcVar7 + ((ulong)bVar3 ^ 5));
    pushValue(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return;
    }
    goto LAB_00128455;
  case arrayValue:
    writeArrayValue(this,value);
    return;
  case objectValue:
    Value::getMemberNames_abi_cxx11_(&local_50,value);
    if (local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{}","");
      pushValue(this,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_00128413;
    }
    else {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{","");
      writeIndent(this);
      psVar1 = &this->document_;
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      indent(this);
      key = local_50.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        pVVar6 = Value::operator[](value,key);
        writeCommentBeforeValue(this,pVVar6);
        valueToQuotedString_abi_cxx11_(&local_70,(Json *)(key->_M_dataplus)._M_p,value_01);
        writeIndent(this);
        std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_70._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        std::__cxx11::string::append((char *)psVar1);
        writeValue(this,pVVar6);
        pbVar2 = local_50.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        key = key + 1;
        if (key != local_50.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::push_back((char)psVar1);
        }
        writeCommentAfterValueOnSameLine(this,pVVar6);
      } while (key != pbVar2);
      unindent(this);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"}","");
      writeIndent(this);
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_00128413:
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_50);
  default:
    goto switchD_001281e3_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_00128455:
    operator_delete(local_70._M_dataplus._M_p);
  }
switchD_001281e3_default:
  return;
}

Assistant:

void StyledWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    pushValue("null");
    break;
  case intValue:
    pushValue(valueToString(value.asLargestInt()));
    break;
  case uintValue:
    pushValue(valueToString(value.asLargestUInt()));
    break;
  case realValue:
    pushValue(valueToString(value.asDouble()));
    break;
  case stringValue:
  {
    // Is NULL possible for value.string_?
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok) pushValue(valueToQuotedStringN(str, static_cast<unsigned>(end-str)));
    else pushValue("");
    break;
  }
  case booleanValue:
    pushValue(valueToString(value.asBool()));
    break;
  case arrayValue:
    writeArrayValue(value);
    break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    if (members.empty())
      pushValue("{}");
    else {
      writeWithIndent("{");
      indent();
      Value::Members::iterator it = members.begin();
      for (;;) {
        const std::string& name = *it;
        const Value& childValue = value[name];
        writeCommentBeforeValue(childValue);
        writeWithIndent(valueToQuotedString(name.c_str()));
        document_ += " : ";
        writeValue(childValue);
        if (++it == members.end()) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        document_ += ',';
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("}");
    }
  } break;
  }
}